

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

Instr * __thiscall LowererMD::LowerToFloat(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  intptr_t pMemLoc;
  BranchInstr *pBVar4;
  undefined4 *puVar5;
  MemRefOpnd *this_00;
  AddrOpndKind addrOpndKind;
  OpCode OVar6;
  Func *pFVar7;
  IRType IVar8;
  
  OVar6 = instr->m_opcode;
  if (BrOnNoEnvProperty < OVar6) {
    if (7 < OVar6 - 0x194) goto switchD_006698b5_caseD_29;
LAB_00669907:
    if (instr->m_kind == InstrKindBranch) {
LAB_00669962:
      pBVar4 = LowerFloatCondBranch((BranchInstr *)instr,false);
      return &pBVar4->super_Instr;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (bVar2) {
      *puVar5 = 0;
      goto LAB_00669962;
    }
    goto LAB_00669ecf;
  }
  if (OVar6 - 0x10 < 6) goto LAB_00669907;
  switch(OVar6) {
  case Neg_A:
    instr->m_opcode = XORPS;
    IVar8 = instr->m_dst->m_type;
    if (IVar8 == TyFloat64) {
LAB_00669dc8:
      pMemLoc = ThreadContextInfo::GetMaskNegDoubleAddr(this->m_func->m_threadContextInfo);
      pFVar7 = this->m_func;
      IVar8 = TyFloat64;
      addrOpndKind = AddrOpndKindDynamicDoubleRef;
    }
    else {
      if (IVar8 != TyFloat32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e26,"(instr->GetDst()->IsFloat64())","instr->GetDst()->IsFloat64()");
        if (!bVar2) goto LAB_00669ecf;
        *puVar5 = 0;
        goto LAB_00669dc8;
      }
      pMemLoc = ThreadContextInfo::GetMaskNegFloatAddr(this->m_func->m_threadContextInfo);
      pFVar7 = this->m_func;
      IVar8 = TyFloat32;
      addrOpndKind = AddrOpndKindDynamicFloatRef;
    }
    this_00 = IR::MemRefOpnd::New(pMemLoc,IVar8,pFVar7,addrOpndKind);
    if (instr->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    pFVar7 = instr->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    bVar3 = (this_00->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      this_00 = (MemRefOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar7);
      bVar3 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar3 | 2;
    instr->m_src2 = &this_00->super_Opnd;
    goto LAB_00669d5d;
  case Not_A:
  case Typeof:
  case TypeofElem:
  case ApplyArgs:
  case ProfiledDiv_A:
  case Rem_A:
  case ProfiledRem_A:
    goto switchD_006698b5_caseD_29;
  case Add_A:
    if (instr->m_dst->m_type != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e05,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    if (instr->m_src1->m_type != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e06,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    OVar6 = instr->m_src1->m_type == TyFloat64 ^ ADDSS;
    break;
  case Div_A:
    if (instr->m_dst->m_type != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e17,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    if (instr->m_src1->m_type != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e18,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    OVar6 = instr->m_src1->m_type == TyFloat64 ^ DIVSS;
    break;
  case Mul_A:
    if (instr->m_dst->m_type != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e11,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    if (instr->m_src1->m_type != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e12,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    OVar6 = (instr->m_src1->m_type != TyFloat64) + MULSD;
    break;
  case Sub_A:
    if (instr->m_dst->m_type != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e0b,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    if (instr->m_src1->m_type != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e0c,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar2) goto LAB_00669ecf;
      *puVar5 = 0;
    }
    OVar6 = instr->m_src1->m_type == TyFloat64 ^ SUBSS;
    break;
  default:
    if (OVar6 - 0xc < 2) goto LAB_00669907;
    goto switchD_006698b5_caseD_29;
  }
  instr->m_opcode = OVar6;
LAB_00669d5d:
  Legalize<false>(instr,false);
  return instr;
switchD_006698b5_caseD_29:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                     ,0x1e40,"((0))","(0)");
  if (!bVar2) {
LAB_00669ecf:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
  goto LAB_00669d5d;
}

Assistant:

IR::Instr *
LowererMD::LowerToFloat(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::Add_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::ADDSD : Js::OpCode::ADDSS;
        break;

    case Js::OpCode::Sub_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::SUBSD : Js::OpCode::SUBSS;
        break;

    case Js::OpCode::Mul_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::MULSD : Js::OpCode::MULSS;
        break;

    case Js::OpCode::Div_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::DIVSD : Js::OpCode::DIVSS;
        break;

    case Js::OpCode::Neg_A:
    {
        IR::Opnd *opnd;
        instr->m_opcode = Js::OpCode::XORPS;
        if (instr->GetDst()->IsFloat32())
        {
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegFloatAddr(), TyFloat32, this->m_func, IR::AddrOpndKindDynamicFloatRef);
        }
        else
        {
            Assert(instr->GetDst()->IsFloat64());
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegDoubleAddr(), TyMachDouble, this->m_func, IR::AddrOpndKindDynamicDoubleRef);
        }
        instr->SetSrc2(opnd);
        break;
    }

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrGt_A:
    case Js::OpCode::BrGe_A:
    case Js::OpCode::BrLt_A:
    case Js::OpCode::BrLe_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotLt_A:
    case Js::OpCode::BrNotLe_A:
        return this->LowerFloatCondBranch(instr->AsBranchInstr());

    default:
        Assume(UNREACHED);
    }

    Legalize(instr);

    return instr;
}